

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

string * __thiscall
backward::details::demangler_impl<backward::system_tag::linux_tag>::demangle_abi_cxx11_
          (demangler_impl<backward::system_tag::linux_tag> *this,char *funcname)

{
  char *pcVar1;
  char *in_RDX;
  handle<char_*,_backward::details::deleter<void,_void_*,_&free>_> *in_RSI;
  string *in_RDI;
  char *result;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *local_18;
  
  local_18 = in_RDX;
  pcVar1 = handle<char_*,_backward::details::deleter<void,_void_*,_&free>_>::get(in_RSI);
  local_20 = (char *)__cxa_demangle(in_RDX,pcVar1,in_RSI + 1,0);
  if (local_20 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,local_18,local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else {
    handle<char_*,_backward::details::deleter<void,_void_*,_&free>_>::update(in_RSI,local_20);
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

std::string demangle(const char *funcname) {
    using namespace details;
    char *result = abi::__cxa_demangle(funcname, _demangle_buffer.get(),
                                       &_demangle_buffer_length, nullptr);
    if (result) {
      _demangle_buffer.update(result);
      return result;
    }
    return funcname;
  }